

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O2

int fld_eq(limb_t *a,limb_t *b)

{
  int i;
  long lVar1;
  uint uVar2;
  fld_t tmp;
  
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    tmp[lVar1] = a[lVar1] - b[lVar1];
  }
  fld_reduce(tmp,tmp);
  for (lVar1 = 1; lVar1 != 5; lVar1 = lVar1 + 1) {
    tmp[0] = tmp[0] | tmp[lVar1];
  }
  for (uVar2 = 0x20; uVar2 != 0; uVar2 = uVar2 >> 1) {
    tmp[0] = tmp[0] | tmp[0] >> (sbyte)uVar2;
  }
  return ~(uint)tmp[0] & 1;
}

Assistant:

int
fld_eq(const fld_t a, const fld_t b)
{
	fld_t tmp;
	limb_t res;
	int i;

	/* tmp <- a - b */
	fld_sub(tmp, a, b);
	fld_reduce(tmp, tmp);

	/* and check tmp for zero */
	res = tmp[0];
	for (i = 1; i < FLD_LIMB_NUM; i++)
		res |= tmp[i];
	for (i = 4*sizeof(limb_t); i > 0; i >>= 1)
                res |= res >> i;

	/* now (res & 1) is zero iff tmp is zero */
	res = ~res & 1;

	return res;
}